

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O2

void Saig_ManWindowOutline_rec(Aig_Man_t *p,Aig_Obj_t *pObj,int nDist,Vec_Ptr_t *vNodes,int *pDists)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  char *__assertion;
  uint uVar5;
  
  while( true ) {
    if (nDist == 0) {
      return;
    }
    if (nDist <= pDists[pObj->Id]) {
      return;
    }
    pDists[pObj->Id] = nDist;
    iVar2 = pObj->TravId;
    iVar3 = p->nTravIds;
    pObj->TravId = iVar3;
    iVar1 = Aig_ObjIsConst1(pObj);
    if (iVar1 != 0) {
      return;
    }
    iVar1 = Saig_ObjIsPo(p,pObj);
    if (iVar1 != 0) break;
    iVar1 = Saig_ObjIsLi(p,pObj);
    if (iVar1 == 0) {
      if (iVar2 != iVar3) {
        Vec_PtrPush(vNodes,pObj);
      }
      iVar2 = Saig_ObjIsPi(p,pObj);
      if (iVar2 != 0) {
        return;
      }
      iVar2 = Saig_ObjIsLo(p,pObj);
      if (iVar2 == 0) {
        if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
          __assertion = "Aig_ObjIsNode(pObj)";
          uVar5 = 0x52;
        }
        else {
          iVar2 = nDist + -1;
          Saig_ManWindowOutline_rec
                    (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),iVar2,vNodes,pDists)
          ;
          Saig_ManWindowOutline_rec
                    (p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),iVar2,vNodes,pDists)
          ;
          if (p->pFanData != (int *)0x0) {
            iVar3 = -1;
            for (uVar5 = 0; uVar5 < *(uint *)&pObj->field_0x18 >> 6; uVar5 = uVar5 + 1) {
              if (uVar5 == 0) {
                iVar3 = Aig_ObjFanout0Int(p,pObj->Id);
              }
              else {
                iVar3 = Aig_ObjFanoutNext(p,iVar3);
              }
              pAVar4 = Aig_ManObj(p,iVar3 >> 1);
              Saig_ManWindowOutline_rec(p,pAVar4,iVar2,vNodes,pDists);
            }
            return;
          }
          __assertion = "p->pFanData";
          uVar5 = 0x55;
        }
      }
      else {
        pAVar4 = Saig_ObjLoToLi(p,pObj);
        if (pAVar4->TravId != p->nTravIds) {
          Saig_ManWindowOutline_rec(p,pAVar4,nDist,vNodes,pDists);
        }
        if (p->pFanData != (int *)0x0) {
          iVar2 = -1;
          for (uVar5 = 0; uVar5 < *(uint *)&pObj->field_0x18 >> 6; uVar5 = uVar5 + 1) {
            if (uVar5 == 0) {
              iVar2 = Aig_ObjFanout0Int(p,pObj->Id);
            }
            else {
              iVar2 = Aig_ObjFanoutNext(p,iVar2);
            }
            pAVar4 = Aig_ManObj(p,iVar2 >> 1);
            Saig_ManWindowOutline_rec(p,pAVar4,nDist + -1,vNodes,pDists);
          }
          return;
        }
        __assertion = "p->pFanData";
        uVar5 = 0x4e;
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigWnd.c"
                    ,uVar5,
                    "void Saig_ManWindowOutline_rec(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *, int *)"
                   );
    }
    pAVar4 = Saig_ObjLiToLo(p,pObj);
    if (pAVar4->TravId != p->nTravIds) {
      Saig_ManWindowOutline_rec(p,pAVar4,nDist,vNodes,pDists);
    }
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    nDist = nDist + -1;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns the array of PI/internal nodes.]

  Description [Marks all the visited nodes with the current ID.
  Does not collect constant node and PO/LI nodes.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Saig_ManWindowOutline_rec( Aig_Man_t * p, Aig_Obj_t * pObj, int nDist, Vec_Ptr_t * vNodes, int * pDists )
{
    Aig_Obj_t * pMatch, * pFanout;
    int fCollected, iFanout = -1, i;
    if ( nDist == 0 )
        return;
    if ( pDists[pObj->Id] >= nDist )
        return;
    pDists[pObj->Id] = nDist;
    fCollected = Aig_ObjIsTravIdCurrent( p, pObj );
    Aig_ObjSetTravIdCurrent( p, pObj );    
    if ( Aig_ObjIsConst1(pObj) )
        return;
    if ( Saig_ObjIsPo(p, pObj) )
        return;
    if ( Saig_ObjIsLi(p, pObj) )
    {
        pMatch = Saig_ObjLiToLo( p, pObj );
        if ( !Aig_ObjIsTravIdCurrent( p, pMatch ) )
            Saig_ManWindowOutline_rec( p, pMatch, nDist, vNodes, pDists );
        Saig_ManWindowOutline_rec( p, Aig_ObjFanin0(pObj), nDist-1, vNodes, pDists );
        return;
    }
    if ( !fCollected )
        Vec_PtrPush( vNodes, pObj );
    if ( Saig_ObjIsPi(p, pObj) )
        return;
    if ( Saig_ObjIsLo(p, pObj) )
    {
        pMatch = Saig_ObjLoToLi( p, pObj );
        if ( !Aig_ObjIsTravIdCurrent( p, pMatch ) )
            Saig_ManWindowOutline_rec( p, pMatch, nDist, vNodes, pDists );
        Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
            Saig_ManWindowOutline_rec( p, pFanout, nDist-1, vNodes, pDists );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Saig_ManWindowOutline_rec( p, Aig_ObjFanin0(pObj), nDist-1, vNodes, pDists );
    Saig_ManWindowOutline_rec( p, Aig_ObjFanin1(pObj), nDist-1, vNodes, pDists );
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        Saig_ManWindowOutline_rec( p, pFanout, nDist-1, vNodes, pDists );
}